

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O2

int VP8LCreateCompressedHuffmanTree(HuffmanTreeCode *tree,HuffmanTreeToken *tokens,int max_tokens)

{
  int iVar1;
  HuffmanTreeToken *pHVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint8_t uVar7;
  char cVar8;
  uint8_t uVar9;
  uint uVar10;
  uint8_t uVar11;
  int i;
  uint uVar12;
  long lVar13;
  bool bVar14;
  
  iVar1 = tree->num_symbols;
  pHVar2 = tokens;
  iVar4 = 0;
  uVar7 = '\b';
LAB_0013458f:
  do {
    if (iVar1 <= iVar4) {
      return (int)((ulong)((long)pHVar2 - (long)tokens) >> 1);
    }
    lVar13 = (long)iVar4;
    uVar11 = tree->code_lengths[lVar13];
    iVar5 = iVar4;
    do {
      lVar13 = lVar13 + 1;
      iVar6 = iVar1;
      if (iVar1 <= lVar13) break;
      iVar6 = iVar5 + 1;
      iVar5 = iVar6;
    } while (tree->code_lengths[lVar13] == uVar11);
    uVar10 = iVar6 - iVar4;
    if (uVar11 == '\0') {
      cVar3 = (char)iVar4 - (char)iVar6;
LAB_001345d8:
      iVar4 = iVar6;
      if ((int)uVar10 < 1) goto LAB_0013458f;
      if (uVar10 < 3) {
        for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
          pHVar2->code = '\0';
          pHVar2->extra_bits = '\0';
          pHVar2 = pHVar2 + 1;
        }
      }
      else {
        if (10 < uVar10) {
          if (uVar10 < 0x8b) {
            cVar8 = -0xb;
            uVar11 = '\x12';
            goto LAB_0013462a;
          }
          pHVar2->code = '\x12';
          pHVar2->extra_bits = '\x7f';
          pHVar2 = pHVar2 + 1;
          uVar10 = uVar10 - 0x8a;
          cVar3 = cVar3 + -0x76;
          goto LAB_001345d8;
        }
        cVar8 = -3;
        uVar11 = '\x11';
LAB_0013462a:
        pHVar2->code = uVar11;
        uVar9 = cVar8 - cVar3;
        uVar11 = uVar7;
LAB_00134630:
        pHVar2->extra_bits = uVar9;
        pHVar2 = pHVar2 + 1;
        iVar4 = iVar6;
        uVar7 = uVar11;
      }
      goto LAB_0013458f;
    }
    if (uVar7 != uVar11) {
      pHVar2->code = uVar11;
      pHVar2->extra_bits = '\0';
      pHVar2 = pHVar2 + 1;
      uVar10 = uVar10 - 1;
    }
    for (; iVar4 = iVar6, uVar7 = uVar11, 0 < (int)uVar10; uVar10 = uVar10 - 6) {
      if (uVar10 < 3) goto LAB_0013467d;
      pHVar2->code = '\x10';
      if (uVar10 < 7) {
        uVar9 = (char)uVar10 + 0xfd;
        goto LAB_00134630;
      }
      pHVar2->extra_bits = '\x03';
      pHVar2 = pHVar2 + 1;
    }
  } while( true );
LAB_0013467d:
  while (bVar14 = uVar10 != 0, uVar10 = uVar10 - 1, bVar14) {
    pHVar2->code = uVar11;
    pHVar2->extra_bits = '\0';
    pHVar2 = pHVar2 + 1;
  }
  goto LAB_0013458f;
}

Assistant:

int VP8LCreateCompressedHuffmanTree(const HuffmanTreeCode* const tree,
                                    HuffmanTreeToken* tokens, int max_tokens) {
  HuffmanTreeToken* const starting_token = tokens;
  HuffmanTreeToken* const ending_token = tokens + max_tokens;
  const int depth_size = tree->num_symbols;
  int prev_value = 8;  // 8 is the initial value for rle.
  int i = 0;
  assert(tokens != NULL);
  while (i < depth_size) {
    const int value = tree->code_lengths[i];
    int k = i + 1;
    int runs;
    while (k < depth_size && tree->code_lengths[k] == value) ++k;
    runs = k - i;
    if (value == 0) {
      tokens = CodeRepeatedZeros(runs, tokens);
    } else {
      tokens = CodeRepeatedValues(runs, tokens, value, prev_value);
      prev_value = value;
    }
    i += runs;
    assert(tokens <= ending_token);
  }
  (void)ending_token;    // suppress 'unused variable' warning
  return (int)(tokens - starting_token);
}